

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.hpp
# Opt level: O2

void __thiscall
Lib::DArray<Lib::ArrayMapEntry<unsigned_int>_>::expand
          (DArray<Lib::ArrayMapEntry<unsigned_int>_> *this,size_t s)

{
  size_t sVar1;
  ArrayMapEntry<unsigned_int> *__ptr;
  ArrayMapEntry<unsigned_int> *pAVar2;
  ArrayMapEntry<unsigned_int> *pAVar3;
  long lVar4;
  ulong uVar5;
  
  if (this->_capacity < s) {
    uVar5 = this->_capacity * 2;
    if (uVar5 <= s) {
      uVar5 = s;
    }
    pAVar2 = (ArrayMapEntry<unsigned_int> *)Lib::alloc(uVar5 * 8);
    sVar1 = this->_size;
    __ptr = this->_array;
    this->_capacity = uVar5;
    this->_array = pAVar2;
    pAVar3 = pAVar2 + sVar1;
    for (lVar4 = 0; sVar1 * 8 != lVar4; lVar4 = lVar4 + 8) {
      *(undefined8 *)((long)&pAVar2->_obj + lVar4) = *(undefined8 *)((long)&__ptr->_obj + lVar4);
    }
    for (lVar4 = uVar5 * 8 + sVar1 * -8; lVar4 != 0; lVar4 = lVar4 + -8) {
      pAVar3->_timestamp = 0;
      pAVar3 = pAVar3 + 1;
    }
    this->_size = s;
    if (__ptr != (ArrayMapEntry<unsigned_int> *)0x0) {
      Lib::free(__ptr);
      return;
    }
  }
  else {
    this->_size = s;
  }
  return;
}

Assistant:

void expand(size_t s)
  {
    if (_capacity >= s) {
      _size = s;
      return;
    }

    size_t oldCapacity=_capacity;
    size_t newCapacity=std::max(s, oldCapacity*2);
    void* mem = ALLOC_KNOWN(sizeof(C)*newCapacity,"DArray<>");

    C* oldArr = _array;

    _capacity = newCapacity;
    _array = static_cast<C*>(mem);

    C* optr=oldArr;
    C* nptr=_array;
    C* firstEmpty=_array+_size;
    C* afterLast=_array+_capacity;

    while(nptr!=firstEmpty) {
      C *oldAddr = optr++, *newAddr = nptr++;
      ::new (newAddr) C(std::move(*oldAddr));
      oldAddr->~C();
    }
    while(nptr!=afterLast) {
      ::new (nptr++) C();
    }
    _size = s;

    if(oldArr) {
      DEALLOC_KNOWN(oldArr,sizeof(C)*oldCapacity,"DArray<>");
    }

  }